

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O2

void __thiscall duckdb::Binder::BindGeneratedColumns(Binder *this,BoundCreateTableInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  int iVar1;
  pointer pCVar2;
  ColumnDefinition *pCVar3;
  string *psVar4;
  LogicalType *pLVar5;
  idx_t index;
  Binder *pBVar6;
  type binder_00;
  _Elt_pointer pLVar7;
  size_type sVar8;
  ParsedExpression *pPVar9;
  pointer pEVar10;
  Binding *pBVar11;
  reference this_01;
  BinderException *this_02;
  ColumnListIterator CVar12;
  allocator local_279;
  Binder *local_278;
  value_type i;
  shared_ptr<duckdb::Binder,_true> binder;
  undefined1 local_258 [16];
  vector<duckdb::LogicalType,_true> types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  optional_ptr<duckdb::Binding,_true> table_binding;
  stack<duckdb::LogicalIndex,_std::deque<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>_>
  bind_order;
  catalog_entry_callback_t local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  ErrorData ignore;
  ExpressionBinder expr_binder;
  logical_index_set_t bound_indices;
  
  local_278 = this;
  pCVar2 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&info->base);
  names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &pCVar2[1].catalog.field_2;
  CVar12 = ColumnList::Logical((ColumnList *)this_00);
  bind_order.c.super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)CVar12.list;
  bind_order.c.super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
  _M_impl.super__Deque_impl_data._M_map_size._0_1_ = CVar12.physical;
  ColumnList::ColumnListIterator::begin
            ((ColumnLogicalIteratorInternal *)&ignore,(ColumnListIterator *)&bind_order);
  ColumnList::ColumnListIterator::end
            ((ColumnLogicalIteratorInternal *)&expr_binder,(ColumnListIterator *)&bind_order);
  while (((pBVar6 = local_278,
          (element_type *)ignore.raw_message._M_string_length !=
          expr_binder.target_type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ||
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ignore.raw_message.field_2._M_allocated_capacity !=
           expr_binder.target_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi))
         || ((_func_int **)ignore._0_8_ != expr_binder._vptr_ExpressionBinder))) {
    pCVar3 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                       ((ColumnLogicalIteratorInternal *)&ignore);
    psVar4 = ColumnDefinition::Name_abi_cxx11_(pCVar3);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&names,psVar4);
    pLVar5 = ColumnDefinition::Type(pCVar3);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,pLVar5
              );
    ignore.raw_message._M_string_length = ignore.raw_message._M_string_length + 1;
  }
  index = GenerateTableIndex(local_278);
  CreateBinder((Binder *)&binder,pBVar6->context,(optional_ptr<duckdb::Binder,_true>)0x0,
               REGULAR_BINDER);
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
  CatalogEntryRetriever::GetCallback(&local_1b0,&local_278->entry_retriever);
  SetCatalogLookupCallback(pBVar6,&local_1b0);
  ::std::_Function_base::~_Function_base(&local_1b0.super__Function_base);
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
  BindContext::AddGenericBinding(&pBVar6->bind_context,index,(string *)(pCVar2 + 1),&names,&types);
  binder_00 = shared_ptr<duckdb::Binder,_true>::operator*(&binder);
  ExpressionBinder::ExpressionBinder(&expr_binder,binder_00,local_278->context,false);
  ErrorData::ErrorData(&ignore);
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
  table_binding = BindContext::GetBinding(&pBVar6->bind_context,(string *)(pCVar2 + 1),&ignore);
  ColumnDependencyManager::GetBindOrder
            (&bind_order,&info->column_dependency_manager,(ColumnList *)this_00);
  bound_indices._M_h._M_buckets = &bound_indices._M_h._M_single_bucket;
  bound_indices._M_h._M_bucket_count = 1;
  bound_indices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  bound_indices._M_h._M_element_count = 0;
  bound_indices._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  bound_indices._M_h._M_rehash_policy._M_next_resize = 0;
  bound_indices._M_h._M_single_bucket = (__node_base_ptr)0x0;
  while( true ) {
    do {
      if (bind_order.c.
          super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          bind_order.c.
          super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) {
        ::std::
        _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&bound_indices._M_h);
        ::std::_Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::
        ~_Deque_base((_Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_> *)
                     &bind_order);
        ErrorData::~ErrorData(&ignore);
        ExpressionBinder::~ExpressionBinder(&expr_binder);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&names);
        return;
      }
      pLVar7 = bind_order.c.
               super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (bind_order.c.
          super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          bind_order.c.
          super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pLVar7 = bind_order.c.
                 super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      i.index = pLVar7[-1].index;
      ::std::deque<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::pop_back
                (&bind_order.c);
      pCVar3 = ColumnList::GetColumnMutable((ColumnList *)this_00,(LogicalIndex)i.index);
      sVar8 = ::std::
              _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(&bound_indices._M_h,&i);
    } while (sVar8 != 0);
    pPVar9 = ColumnDefinition::GeneratedExpression(pCVar3);
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])
              ((LogicalType *)(local_258 + 8),pPVar9);
    ExpressionBinder::Bind
              ((ExpressionBinder *)local_258,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&expr_binder,(LogicalType *)(local_258 + 8),false);
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)local_258);
    iVar1 = (*(pEVar10->super_BaseExpression)._vptr_BaseExpression[4])(pEVar10);
    if ((char)iVar1 != '\0') break;
    pLVar5 = ColumnDefinition::Type(pCVar3);
    if (pLVar5->id_ == ANY) {
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_258);
      ColumnDefinition::ChangeGeneratedExpressionType(pCVar3,&pEVar10->return_type);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_258);
      ColumnDefinition::SetType(pCVar3,&pEVar10->return_type);
      pLVar5 = ColumnDefinition::Type(pCVar3);
      pBVar11 = optional_ptr<duckdb::Binding,_true>::operator->(&table_binding);
      this_01 = vector<duckdb::LogicalType,_true>::get<true>(&pBVar11->types,i.index);
      LogicalType::operator=(this_01,pLVar5);
    }
    ::std::__detail::
    _Insert_base<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&bound_indices._M_h,&i);
    if ((ClientContext *)local_258._0_8_ != (ClientContext *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_258._0_8_)->__weak_this_
                  ).internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)();
    }
    if ((__buckets_ptr)local_258._8_8_ != (__buckets_ptr)0x0) {
      (*(code *)(*(__node_base_ptr *)local_258._8_8_)[1]._M_nxt)();
    }
  }
  this_02 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_170,
             "Failed to bind generated column \'%s\' because the expression contains a subquery",
             &local_279);
  psVar4 = ColumnDefinition::Name_abi_cxx11_(pCVar3);
  ::std::__cxx11::string::string((string *)&local_190,(string *)psVar4);
  BinderException::BinderException<std::__cxx11::string>(this_02,&local_170,&local_190);
  __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Binder::BindGeneratedColumns(BoundCreateTableInfo &info) {
	auto &base = info.base->Cast<CreateTableInfo>();

	vector<string> names;
	vector<LogicalType> types;

	D_ASSERT(base.type == CatalogType::TABLE_ENTRY);
	for (auto &col : base.columns.Logical()) {
		names.push_back(col.Name());
		types.push_back(col.Type());
	}
	auto table_index = GenerateTableIndex();

	// Create a new binder because we dont need (or want) these bindings in this scope
	auto binder = Binder::CreateBinder(context);
	binder->SetCatalogLookupCallback(entry_retriever.GetCallback());
	binder->bind_context.AddGenericBinding(table_index, base.table, names, types);
	auto expr_binder = ExpressionBinder(*binder, context);
	ErrorData ignore;
	auto table_binding = binder->bind_context.GetBinding(base.table, ignore);
	D_ASSERT(table_binding && !ignore.HasError());

	auto bind_order = info.column_dependency_manager.GetBindOrder(base.columns);
	logical_index_set_t bound_indices;

	while (!bind_order.empty()) {
		auto i = bind_order.top();
		bind_order.pop();
		auto &col = base.columns.GetColumnMutable(i);

		//! Already bound this previously
		//! This can not be optimized out of the GetBindOrder function
		//! These occurrences happen because we need to make sure that ALL dependencies of a column are resolved before
		//! it gets resolved
		if (bound_indices.count(i)) {
			continue;
		}
		D_ASSERT(col.Generated());
		auto expression = col.GeneratedExpression().Copy();

		auto bound_expression = expr_binder.Bind(expression);
		D_ASSERT(bound_expression);
		if (bound_expression->HasSubquery()) {
			throw BinderException("Failed to bind generated column '%s' because the expression contains a subquery",
			                      col.Name());
		}
		if (col.Type().id() == LogicalTypeId::ANY) {
			// Do this before changing the type, so we know it's the first time the type is set
			col.ChangeGeneratedExpressionType(bound_expression->return_type);
			col.SetType(bound_expression->return_type);

			// Update the type in the binding, for future expansions
			table_binding->types[i.index] = col.Type();
		}
		bound_indices.insert(i);
	}
}